

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::RenderingVenue::Pimpl::SessionImpl::~SessionImpl(SessionImpl *this)

{
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__SessionImpl_002fc958;
  TaskThread::Queue::detach(&this->taskQueue);
  removeActiveSession(this->venue,this);
  std::_Function_base::~_Function_base(&(this->postRenderCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->preRenderCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->getBlockSizeCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->beginNextBlockCallback).super__Function_base);
  std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::~unique_ptr
            (&this->performer);
  std::
  vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>,_std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>_>_>
  ::~vector(&(this->taskQueue).tasks);
  return;
}

Assistant:

~SessionImpl() override
        {
            taskQueue.detach();
            venue.removeActiveSession (*this);
        }